

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ck_seg.c
# Opt level: O2

int ck_seg(acmod_set_t *acmod_set,acmod_id_t *phone,uint32 n_phone,uint16 *seg,uint32 n_frame,
          char *utt_name)

{
  acmod_id_t *paVar1;
  acmod_id_t id;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lStack_60;
  
  if (n_phone == 0) {
    if (n_frame == 0) {
      return 0;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
            ,0x47,"utt %s: No phones, but non-empty seg exists\n");
  }
  else {
    uVar5 = (uint)*seg;
    if ((short)*seg < 0) {
      id = acmod_set_base_phone(acmod_set,*phone);
      uVar7 = n_frame + (n_frame == 0);
      uVar2 = 1;
      do {
        if (n_frame <= uVar2) {
LAB_0010ebf5:
          uVar2 = 1;
          do {
            uVar5 = (uVar5 & 0x7fff) / 0x13;
            if (((n_frame <= uVar7) || (id != uVar5)) || (n_phone <= uVar2)) {
              if (id != uVar5) {
                pcVar4 = acmod_set_id2name(acmod_set,id);
                pcVar3 = acmod_set_id2name(acmod_set,uVar5);
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
                        ,0x6d,
                        "utt %s: phone %u, %s, in transcript does not match phone %s in seg at frame %u\n"
                        ,utt_name,(ulong)((uint32)uVar2 - 1),pcVar4,pcVar3,(ulong)(uVar7 - 1));
                return -1;
              }
              if ((uVar2 < n_phone) && (uVar7 == n_frame)) {
                pcVar4 = "utt_name %s: seg phone seq shorter than given phone seq\n";
                lStack_60 = 0x75;
              }
              else {
                if ((uint32)uVar2 != n_phone) {
                  return 0;
                }
                if (n_frame <= uVar7) {
                  return 0;
                }
                pcVar4 = "utt_name %s: seg phone seq longer than given phone seq\n";
                lStack_60 = 0x7e;
              }
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
                      ,lStack_60,pcVar4,utt_name);
              return -1;
            }
            uVar6 = (ulong)uVar7;
            uVar5 = (uint)seg[uVar6];
            paVar1 = phone + uVar2;
            uVar2 = uVar2 + 1;
            id = acmod_set_base_phone(acmod_set,*paVar1);
            uVar8 = uVar7;
            do {
              uVar6 = uVar6 + 1;
              uVar7 = n_frame;
              if (n_frame <= uVar6) break;
              uVar7 = uVar8 + 1;
              uVar8 = uVar7;
            } while (-1 < (short)seg[uVar6]);
          } while( true );
        }
        if ((short)seg[uVar2] < 0) {
          uVar7 = (uint)uVar2;
          goto LAB_0010ebf5;
        }
        uVar2 = uVar2 + 1;
      } while( true );
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
            ,0x4e,"utt %s: Expected beginning of phone indicator for at frame %u\n",utt_name,0);
  }
  return -1;
}

Assistant:

int
ck_seg(acmod_set_t *acmod_set,
       acmod_id_t *phone,
       uint32 n_phone,
       uint16 *seg,
       uint32 n_frame,
       const char *utt_name)
{
    uint32	phone_i;
    uint32	seg_ci;
    acmod_id_t	trans_ci;
    uint32 f;
    uint32 n_state = MAX_N_STATE-1;	/* # of emitting states/model */

    if (n_phone == 0) {
	if (n_frame == 0) 
	    return S3_SUCCESS;
	else {
	    E_ERROR("utt %s: No phones, but non-empty seg exists\n");
	    return S3_ERROR;
	}
    }

    if ((seg[0] & 0x8000) == 0) {
	E_ERROR("utt %s: Expected beginning of phone indicator for at frame %u\n",
		utt_name, 0);

	return S3_ERROR;
    }

    phone_i = 0;
    f = 0;

    seg_ci = (seg[f++] & 0x7FFF) / n_state;
    trans_ci = acmod_set_base_phone(acmod_set, phone[phone_i++]);
    /* skip over non-begin frames */
    for (; ((f < n_frame) && ((seg[f] & 0x8000) == 0)); f++);

    while ((seg_ci == trans_ci) &&
	   (f < n_frame) &&
	   (phone_i < n_phone)) {
	
	seg_ci = (seg[f++] & 0x7FFF) / n_state;
	
	trans_ci = acmod_set_base_phone(acmod_set, phone[phone_i++]);
	
	/* skip over non-begin frames */
	for (; ((f < n_frame ) && ((seg[f] & 0x8000) == 0)); f++);
    }

    if (seg_ci != trans_ci) {
	E_ERROR("utt %s: phone %u, %s, in transcript does not match phone %s in seg at frame %u\n",
		utt_name,
		phone_i-1,
		acmod_set_id2name(acmod_set, trans_ci),
		acmod_set_id2name(acmod_set, seg_ci),
		f-1);
	
	return S3_ERROR;
    }

    if ((phone_i < n_phone) && (f == n_frame)) {
	/* i.e. got to end of seg sequence before end of phone seq */
	E_ERROR("utt_name %s: seg phone seq shorter than given phone seq\n",
		utt_name);
	
	return S3_ERROR;
    }

    if ((phone_i == n_phone) && (f < n_frame)) {
	/* i.e. got to end of phone sequence before end of seg seq */

	E_ERROR("utt_name %s: seg phone seq longer than given phone seq\n",
		utt_name);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}